

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

bool __thiscall presolve::HPresolve::isImpliedIntegral(HPresolve *this,HighsInt col)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer pdVar7;
  bool bVar8;
  byte bVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  byte bVar11;
  long lVar12;
  char cVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  double *pdVar15;
  HighsInt *pHVar16;
  int *piVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  lVar18 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  bVar19 = lVar18 == -1;
  if (bVar19) {
    bVar9 = 1;
  }
  else {
    pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar18;
    piVar17 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar18;
    piVar6 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar11 = 1;
    do {
      iVar4 = *piVar17;
      iVar5 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      cVar13 = '\x03';
      if (iVar5 < 2) {
LAB_0030b5a8:
        bVar9 = 0;
      }
      else {
        bVar9 = 0;
        if (iVar5 <= (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar4]) {
          dVar20 = (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
          dVar22 = -dVar20;
          pvVar1 = &this->model->row_lower_;
          pvVar14 = &this->model->row_upper_;
          pdVar2 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar4;
          pvVar10 = pvVar1;
          if (*pdVar2 <= dVar22 && dVar22 != *pdVar2) {
            pvVar10 = pvVar14;
          }
          if (dVar20 < (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar4]) {
            pvVar14 = pvVar1;
          }
          dVar20 = (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
          pdVar2 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + iVar4;
          cVar13 = '\0';
          bVar9 = bVar11;
          if ((dVar20 == *pdVar2) && (!NAN(dVar20) && !NAN(*pdVar2))) {
            bVar8 = rowCoefficientsIntegral(this,iVar4,1.0 / *pdVar15);
            cVar13 = !bVar8 * '\x02' + '\x01';
            goto LAB_0030b5a8;
          }
        }
      }
      if ((cVar13 != '\x03') && (cVar13 != '\0')) break;
      lVar12 = (long)(int)lVar18;
      lVar18 = (long)piVar6[lVar12];
      piVar17 = piVar17 + (lVar18 - lVar12);
      pdVar15 = pdVar15 + (lVar18 - lVar12);
      bVar19 = lVar18 == -1;
      bVar11 = bVar9;
    } while (!bVar19);
  }
  if ((bVar9 & bVar19) == 0) {
    bVar19 = (bool)(bVar19 ^ 1);
  }
  else {
    lVar18 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
    if (lVar18 != -1) {
      piVar6 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18;
      pHVar16 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18;
      bVar19 = true;
      do {
        dVar20 = 1.0 / *pdVar15;
        bVar8 = rowCoefficientsIntegral(this,*pHVar16,dVar20);
        if (bVar8) {
          iVar4 = *pHVar16;
          pdVar7 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar22 = pdVar7[iVar4];
          if (dVar22 < INFINITY) {
            dVar3 = *pdVar15;
            dVar21 = floor(ABS(dVar20) * dVar22 + this->primal_feastol);
            dVar22 = ABS(dVar22 - dVar21 * ABS(dVar3));
            pdVar2 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
            if (*pdVar2 <= dVar22 && dVar22 != *pdVar2) {
              pdVar7[iVar4] = dVar21 * ABS(dVar3);
              markChangedRow(this,iVar4);
            }
          }
          iVar4 = *pHVar16;
          pdVar7 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          dVar22 = pdVar7[iVar4];
          if (-INFINITY < dVar22) {
            dVar3 = *pdVar15;
            dVar20 = ceil(ABS(dVar20) * dVar22 - this->primal_feastol);
            dVar22 = ABS(dVar22 - dVar20 * ABS(dVar3));
            pdVar2 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
            if (*pdVar2 <= dVar22 && dVar22 != *pdVar2) {
              pdVar7[iVar4] = dVar20 * ABS(dVar3);
              markChangedRow(this,iVar4);
            }
          }
        }
        else {
          bVar19 = false;
        }
        if (!bVar8) {
          return bVar19;
        }
        lVar12 = (long)(int)lVar18;
        lVar18 = (long)piVar6[lVar12];
        pHVar16 = pHVar16 + (lVar18 - lVar12);
        pdVar15 = pdVar15 + (lVar18 - lVar12);
      } while (lVar18 != -1);
    }
    bVar19 = true;
  }
  return bVar19;
}

Assistant:

bool HPresolve::isImpliedIntegral(HighsInt col) {
  // check if the integer constraint on a variable is implied by the model
  assert(model->integrality_[col] == HighsVarType::kInteger);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] < rowsize[nz.index()]) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();
      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        // todo infeasible
      }

      return true;
    }
  }

  if (!runDualDetection) return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    // if row coefficients are not integral, variable is not (implied) integral
    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
    if (model->row_upper_[nz.index()] != kHighsInf) {
      // right-hand side: scale, round down and unscale again
      double rUpper =
          std::abs(nz.value()) *
          std::floor(model->row_upper_[nz.index()] * std::abs(scale) +
                     primal_feastol);
      // check if modification is large enough
      if (std::abs(model->row_upper_[nz.index()] - rUpper) >
          options->small_matrix_value) {
        // update right-hand side and mark row as changed
        model->row_upper_[nz.index()] = rUpper;
        markChangedRow(nz.index());
      }
    }
    if (model->row_lower_[nz.index()] != -kHighsInf) {
      // left-hand side: scale, round up and unscale again
      double rLower =
          std::abs(nz.value()) *
          std::ceil(model->row_lower_[nz.index()] * std::abs(scale) -
                    primal_feastol);
      // check if modification is large enough
      if (std::abs(model->row_lower_[nz.index()] - rLower) >
          options->small_matrix_value) {
        // update left-hand side and mark row as changed
        model->row_lower_[nz.index()] = rLower;
        markChangedRow(nz.index());
      }
    }
  }

  return true;
}